

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O2

void gauden_free(gauden_t *g)

{
  gauden_free_l_acc(g);
  gauden_free_acc(g);
  if (g->mean != (vector_t ***)0x0) {
    gauden_free_param(g->mean);
  }
  g->mean = (vector_t ***)0x0;
  if (g->var != (vector_t ***)0x0) {
    gauden_free_param(g->var);
  }
  if (g->fullvar != (vector_t ****)0x0) {
    gauden_free_param_full(g->fullvar);
  }
  g->var = (vector_t ***)0x0;
  g->fullvar = (vector_t ****)0x0;
  if (g->norm != (float32 ***)0x0) {
    ckd_free_3d(g->norm);
  }
  g->norm = (float32 ***)0x0;
  if (g->veclen != (uint32 *)0x0) {
    ckd_free(g->veclen);
  }
  g->veclen = (uint32 *)0x0;
  ckd_free(g);
  return;
}

Assistant:

void
gauden_free(gauden_t *g)
{
    /* free the utterance accumulators (if any) */
    gauden_free_l_acc(g);

    /* free the corpus accumulators (if any) */
    gauden_free_acc(g);

    /* free the means (if any) */
    if (g->mean)
	gauden_free_param(g->mean);
    g->mean = NULL;

    /* free the variances (if any) */
    if (g->var)
	gauden_free_param(g->var);
    if (g->fullvar)
	gauden_free_param_full(g->fullvar);
	    
    g->var = NULL;
    g->fullvar = NULL;

    /* free the density normalization terms */
    if (g->norm)
	ckd_free_3d((void ***)g->norm);
    g->norm = NULL;
    
    if (g->veclen)
	ckd_free(g->veclen);
    g->veclen = NULL;

    /* finally free the gauden structure itself */
    ckd_free(g);
}